

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O3

DdNode * Cudd_zddComplement(DdManager *dd,DdNode *node)

{
  DdNode *n;
  DdNode *n_00;
  DdNode *zdd_I;
  DdNode *local_28;
  
  local_28 = cuddCacheLookup1Zdd(dd,cuddZddComplement,node);
  if (local_28 == (DdNode *)0x0) {
    n = Cudd_MakeBddFromZddCover(dd,node);
    if (n != (DdNode *)0x0) {
      Cudd_Ref(n);
      n_00 = Cudd_zddIsop(dd,(DdNode *)((ulong)n ^ 1),(DdNode *)((ulong)n ^ 1),&local_28);
      if (n_00 != (DdNode *)0x0) {
        Cudd_Ref(n_00);
        Cudd_Ref(local_28);
        Cudd_RecursiveDeref(dd,n);
        Cudd_RecursiveDeref(dd,n_00);
        cuddCacheInsert1(dd,cuddZddComplement,node,local_28);
        Cudd_Deref(local_28);
        return local_28;
      }
      Cudd_RecursiveDeref(dd,n);
    }
    local_28 = (DdNode *)0x0;
  }
  return local_28;
}

Assistant:

DdNode  *
Cudd_zddComplement(
  DdManager *dd,
  DdNode *node)
{
    DdNode      *b, *isop, *zdd_I;

    /* Check cache */
    zdd_I = cuddCacheLookup1Zdd(dd, cuddZddComplement, node);
    if (zdd_I)
        return(zdd_I);

    b = Cudd_MakeBddFromZddCover(dd, node);
    if (!b)
        return(NULL);
    Cudd_Ref(b);
    isop = Cudd_zddIsop(dd, Cudd_Not(b), Cudd_Not(b), &zdd_I);
    if (!isop) {
        Cudd_RecursiveDeref(dd, b);
        return(NULL);
    }
    Cudd_Ref(isop);
    Cudd_Ref(zdd_I);
    Cudd_RecursiveDeref(dd, b);
    Cudd_RecursiveDeref(dd, isop);

    cuddCacheInsert1(dd, cuddZddComplement, node, zdd_I);
    Cudd_Deref(zdd_I);
    return(zdd_I);
}